

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O2

void __thiscall fasttext::Args::printDictionaryHelp(Args *this)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,
                           "\nThe following arguments for the dictionary are optional:\n");
  poVar1 = std::operator<<(poVar1,"  -minCount           minimal number of word occurences [");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->minCount);
  poVar1 = std::operator<<(poVar1,"]\n");
  poVar1 = std::operator<<(poVar1,"  -minCountLabel      minimal number of label occurences [");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->minCountLabel);
  poVar1 = std::operator<<(poVar1,"]\n");
  poVar1 = std::operator<<(poVar1,"  -wordNgrams         max length of word ngram [");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->wordNgrams);
  poVar1 = std::operator<<(poVar1,"]\n");
  poVar1 = std::operator<<(poVar1,"  -bucket             number of buckets [");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->bucket);
  poVar1 = std::operator<<(poVar1,"]\n");
  poVar1 = std::operator<<(poVar1,"  -minn               min length of char ngram [");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->minn);
  poVar1 = std::operator<<(poVar1,"]\n");
  poVar1 = std::operator<<(poVar1,"  -maxn               max length of char ngram [");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->maxn);
  poVar1 = std::operator<<(poVar1,"]\n");
  std::operator<<(poVar1,"  -t                  sampling threshold [");
  poVar1 = std::ostream::_M_insert<double>(this->t);
  poVar1 = std::operator<<(poVar1,"]\n");
  poVar1 = std::operator<<(poVar1,"  -label              labels prefix [");
  poVar1 = std::operator<<(poVar1,(string *)&this->label);
  std::operator<<(poVar1,"]\n");
  return;
}

Assistant:

void Args::printDictionaryHelp() {
  std::cerr
    << "\nThe following arguments for the dictionary are optional:\n"
    << "  -minCount           minimal number of word occurences [" << minCount << "]\n"
    << "  -minCountLabel      minimal number of label occurences [" << minCountLabel << "]\n"
    << "  -wordNgrams         max length of word ngram [" << wordNgrams << "]\n"
    << "  -bucket             number of buckets [" << bucket << "]\n"
    << "  -minn               min length of char ngram [" << minn << "]\n"
    << "  -maxn               max length of char ngram [" << maxn << "]\n"
    << "  -t                  sampling threshold [" << t << "]\n"
    << "  -label              labels prefix [" << label << "]\n";
}